

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O0

ssize_t peek_at_header(archive_read_filter *filter,int *pbits)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  void *pvVar4;
  ssize_t *in_RSI;
  size_t in_RDI;
  int header_flags;
  int bits;
  ssize_t len;
  ssize_t avail;
  uchar *p;
  long local_30;
  long local_28;
  void *local_20;
  archive_read_filter *in_stack_fffffffffffffff8;
  
  local_30 = 10;
  local_20 = __archive_read_filter_ahead(in_stack_fffffffffffffff8,in_RDI,in_RSI);
  if ((local_20 == (void *)0x0) || (local_28 == 0)) {
    local_30 = 0;
  }
  else {
    iVar3 = memcmp(local_20,anon_var_dwarf_503fd,3);
    if (iVar3 == 0) {
      if ((*(byte *)((long)local_20 + 3) & 0xe0) == 0) {
        bVar1 = *(byte *)((long)local_20 + 3);
        if ((bVar1 & 4) != 0) {
          local_20 = __archive_read_filter_ahead(in_stack_fffffffffffffff8,in_RDI,in_RSI);
          if (local_20 == (void *)0x0) {
            return 0;
          }
          local_30 = (long)(int)(uint)*(ushort *)((long)local_20 + 10) + 0xc;
        }
        bVar2 = bVar1 & 8;
        while (bVar2 != 0) {
          if (local_28 < local_30 + 1) {
            local_20 = __archive_read_filter_ahead(in_stack_fffffffffffffff8,in_RDI,in_RSI);
          }
          if (local_20 == (void *)0x0) {
            return 0;
          }
          bVar2 = *(byte *)((long)local_20 + local_30);
          local_30 = local_30 + 1;
        }
        bVar2 = bVar1 & 0x10;
        while (bVar2 != 0) {
          if (local_28 < local_30 + 1) {
            local_20 = __archive_read_filter_ahead(in_stack_fffffffffffffff8,in_RDI,in_RSI);
          }
          if (local_20 == (void *)0x0) {
            return 0;
          }
          bVar2 = *(byte *)((long)local_20 + local_30);
          local_30 = local_30 + 1;
        }
        if ((bVar1 & 2) != 0) {
          pvVar4 = __archive_read_filter_ahead(in_stack_fffffffffffffff8,in_RDI,in_RSI);
          if (pvVar4 == (void *)0x0) {
            return 0;
          }
          local_30 = local_30 + 2;
        }
        if (in_RSI != (ssize_t *)0x0) {
          *(undefined4 *)in_RSI = 0x1b;
        }
      }
      else {
        local_30 = 0;
      }
    }
    else {
      local_30 = 0;
    }
  }
  return local_30;
}

Assistant:

static ssize_t
peek_at_header(struct archive_read_filter *filter, int *pbits)
{
	const unsigned char *p;
	ssize_t avail, len;
	int bits = 0;
	int header_flags;

	/* Start by looking at the first ten bytes of the header, which
	 * is all fixed layout. */
	len = 10;
	p = __archive_read_filter_ahead(filter, len, &avail);
	if (p == NULL || avail == 0)
		return (0);
	/* We only support deflation- third byte must be 0x08. */
	if (memcmp(p, "\x1F\x8B\x08", 3) != 0)
		return (0);
	bits += 24;
	if ((p[3] & 0xE0)!= 0)	/* No reserved flags set. */
		return (0);
	bits += 3;
	header_flags = p[3];
	/* Bytes 4-7 are mod time. */
	/* Byte 8 is deflate flags. */
	/* XXXX TODO: return deflate flags back to consume_header for use
	   in initializing the decompressor. */
	/* Byte 9 is OS. */

	/* Optional extra data:  2 byte length plus variable body. */
	if (header_flags & 4) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
		len += ((int)p[len + 1] << 8) | (int)p[len];
		len += 2;
	}

	/* Null-terminated optional filename. */
	if (header_flags & 8) {
		do {
			++len;
			if (avail < len)
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);
	}

	/* Null-terminated optional comment. */
	if (header_flags & 16) {
		do {
			++len;
			if (avail < len)
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);
	}

	/* Optional header CRC */
	if ((header_flags & 2)) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
#if 0
	int hcrc = ((int)p[len + 1] << 8) | (int)p[len];
	int crc = /* XXX TODO: Compute header CRC. */;
	if (crc != hcrc)
		return (0);
	bits += 16;
#endif
		len += 2;
	}

	if (pbits != NULL)
		*pbits = bits;
	return (len);
}